

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

uint Clasp::compare_and_swap<unsigned_int>(atomic<unsigned_int> *in,uint oldVal,uint newVal)

{
  memory_order mVar1;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  bool bVar3;
  memory_order in_stack_ffffffffffffff04;
  uint local_4c [3];
  undefined4 local_40;
  uint *local_38;
  
  local_38 = local_4c;
  local_40 = 5;
  local_4c[0] = in_ESI;
  mVar1 = std::__cmpexch_failure_order(in_stack_ffffffffffffff04);
  switch(0x12be1a) {
  default:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    break;
  case 2:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    break;
  case 3:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    break;
  case 4:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
    else {
      LOCK();
      uVar2 = *in_RDI;
      bVar3 = local_4c[0] == uVar2;
      if (bVar3) {
        *in_RDI = in_EDX;
        uVar2 = local_4c[0];
      }
      UNLOCK();
      if (!bVar3) {
        local_4c[0] = uVar2;
      }
    }
  }
  return local_4c[0];
}

Assistant:

T compare_and_swap(std::atomic<T>& in, T oldVal, T newVal) {
	in.compare_exchange_strong(oldVal, newVal);
	return oldVal;
}